

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cor.h
# Opt level: O0

void escreverCor(ostream *out,cor corPixel,int samplesPorPixel)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double b;
  double g;
  double r;
  double escala;
  int samplesPorPixel_local;
  ostream *out_local;
  
  dVar2 = 1.0 / (double)samplesPorPixel;
  dVar3 = vector3::x(&corPixel);
  dVar3 = sqrt(dVar3 * dVar2);
  dVar4 = vector3::y(&corPixel);
  dVar4 = sqrt(dVar4 * dVar2);
  dVar5 = vector3::z(&corPixel);
  dVar2 = sqrt(dVar5 * dVar2);
  dVar3 = clamp(dVar3,0.0,0.999);
  poVar1 = (ostream *)std::ostream::operator<<(out,(int)(dVar3 * 256.0));
  poVar1 = std::operator<<(poVar1,' ');
  dVar3 = clamp(dVar4,0.0,0.999);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)(dVar3 * 256.0));
  poVar1 = std::operator<<(poVar1,' ');
  dVar2 = clamp(dVar2,0.0,0.999);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)(dVar2 * 256.0));
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void escreverCor(std::ostream &out, cor corPixel, const int samplesPorPixel) {
    const double escala = 1.0 / samplesPorPixel;

    // Pegar a cor de cada pixel, dividindo pela escala
    // Realizar correção de gamma para gamma 2
    const double r = sqrt(corPixel.x() * escala);
    const double g = sqrt(corPixel.y() * escala);
    const double b = sqrt(corPixel.z() * escala);

    // Escrever as cores mapeadas entre 0 <= cor < 1
    out << static_cast<int>(256 * clamp(r, 0.0, 0.999)) << ' '
        << static_cast<int>(256 * clamp(g, 0.0, 0.999)) << ' '
        << static_cast<int>(256 * clamp(b, 0.0, 0.999)) << '\n';
}